

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

void gmlc::utilities::string_viewOps::trim(string_viewVector *input,string_view trimCharacters)

{
  string_view input_00;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference pbVar4;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RDX;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RSI;
  char *in_RDI;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> *istr;
  iterator __end2;
  iterator __begin2;
  string_viewVector *__range2;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  size_t local_48;
  char *local_40;
  
  iVar2 = CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::begin(in_stack_ffffffffffffff98);
  iVar3 = CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          *)&stack0xffffffffffffffd8);
    input_00._M_str = in_RDI;
    input_00._M_len = (size_t)iVar2._M_current;
    sVar5._M_str = (char *)iVar3._M_current;
    sVar5._M_len = (size_t)pbVar4;
    in_stack_ffffffffffffff98 = in_RSI;
    in_stack_ffffffffffffffa0 = in_RDX;
    sVar5 = trim(input_00,sVar5);
    local_48 = sVar5._M_len;
    pbVar4->_M_len = local_48;
    local_40 = sVar5._M_str;
    pbVar4->_M_str = local_40;
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void trim(string_viewVector& input, std::string_view trimCharacters)
{
    for (auto& istr : input) {
        istr = trim(istr, trimCharacters);
    }
}